

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRhs<0>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *con,int param_3)

{
  double dVar1;
  double dVar2;
  AlgConRange rng_00;
  bool bVar3;
  bool bVar4;
  Arguments *lt_00;
  size_t sVar5;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *in_RSI;
  undefined8 in_RDI;
  NLConstraint nlc;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> lc;
  bool need_nlc;
  int exprResVar;
  AlgConRange rng;
  LinearFunctionalConstraint exprTerm;
  LinTerms lt;
  undefined1 in_stack_00000a5f;
  LinTerms *in_stack_00000a60;
  undefined4 in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffa20;
  LinTerms *in_stack_fffffffffffffa28;
  LinTerms *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  undefined1 fSort;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffa48;
  AlgConRange *this_00;
  AlgConRhs<0> in_stack_fffffffffffffa50;
  CtxVal local_564;
  undefined1 in_stack_fffffffffffffac3;
  undefined4 in_stack_fffffffffffffac4;
  int expr;
  NLConstraint *this_01;
  undefined4 uVar6;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_02;
  LinTerms *in_stack_fffffffffffffb98;
  LinTerms *in_stack_fffffffffffffba0;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffba8;
  Context local_178;
  int local_174;
  double local_170;
  double local_168;
  AlgConRange local_160 [12];
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *local_18;
  byte local_1;
  
  fSort = (undefined1)((ulong)in_stack_fffffffffffffa38 >> 0x38);
  uVar6 = (undefined4)in_RDI;
  var = (int)((ulong)in_RDI >> 0x20);
  this_02 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)&stack0xffffffffffffff68;
  local_18 = in_RSI;
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffa20);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(local_18);
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_168 = (double)AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(local_18);
  this_01 = (NLConstraint *)AlgConRhs<0>::lb((AlgConRhs<0> *)0x48f1e5);
  local_170 = (double)AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(local_18);
  dVar1 = AlgConRhs<0>::ub((AlgConRhs<0> *)0x48f211);
  AlgConRange::AlgConRange(local_160,(double)this_01,dVar1);
  local_174 = -1;
  lt_00 = LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x48f244);
  bVar3 = AlgebraicExpression<mp::LinTerms>::is_variable
                    ((AlgebraicExpression<mp::LinTerms> *)in_stack_fffffffffffffa20);
  expr = CONCAT13(bVar3,(int3)in_stack_fffffffffffffac4);
  if (bVar3) {
    LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x48f27e);
    local_174 = LinTerms::get_representing_variable((LinTerms *)0x48f295);
  }
  else {
    LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x48f2f0);
    bVar3 = LinTerms::empty((LinTerms *)0x48f307);
    if (!bVar3) {
      dVar1 = AlgConRange::lb(local_160);
      dVar2 = BasicFlatConverter::PracticallyMinusInf();
      if (dVar1 <= dVar2) {
        local_564 = CTX_NEG;
      }
      else {
        dVar1 = AlgConRange::ub(local_160);
        dVar2 = BasicFlatConverter::PracticallyInf();
        local_564 = CTX_POS;
        if (dVar1 < dVar2) {
          local_564 = CTX_MIX;
        }
      }
      Context::Context(&local_178,local_564);
      FunctionalConstraint::AddContext
                ((FunctionalConstraint *)
                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 (Context)(CtxVal)((ulong)in_stack_fffffffffffffa20 >> 0x20));
      local_174 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                            (in_stack_fffffffffffffa48,
                             (LinearFunctionalConstraint *)
                             CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    }
  }
  bVar3 = false;
  if (-1 < local_174) {
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                      (&in_stack_fffffffffffffa20->super_FlatModel<mp::DefaultFlatModelParams>,
                       in_stack_fffffffffffffa1c);
    if (!bVar4) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
                (&in_stack_fffffffffffffa20->super_FlatModel<mp::DefaultFlatModelParams>,
                 in_stack_fffffffffffffa1c);
    }
    bVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::UserAcceptsAndRecommends<mp::NLConstraint>
                      (in_stack_fffffffffffffa20,
                       (NLConstraint *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                      );
    if (!bVar4) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsResultVar
                (&in_stack_fffffffffffffa20->super_FlatModel<mp::DefaultFlatModelParams>,
                 in_stack_fffffffffffffa1c);
    }
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      (&in_stack_fffffffffffffa20->super_FlatModel<mp::DefaultFlatModelParams>,
                       in_stack_fffffffffffffa1c);
    if (bVar4) {
      LinTerms::add_term(in_stack_fffffffffffffa30,(double)in_stack_fffffffffffffa28,
                         (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
      LinTerms::sort_terms(in_stack_00000a60,(bool)in_stack_00000a5f);
      sVar5 = LinTerms::size((LinTerms *)0x48f4e3);
      if (sVar5 < 2) {
        this_00 = local_160;
        AlgConRange::lb(this_00);
        AlgConRange::ub(this_00);
        FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::NarrowVarBounds(this_02,var,(double)this_01,(double)lt_00);
        local_1 = 1;
        goto LAB_0048f840;
      }
      bVar3 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                        (in_stack_fffffffffffffa20,
                         (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
                         CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      if (bVar3) {
        LinTerms::LinTerms(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(local_18);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)in_stack_fffffffffffffa48
                   ,(LinTerms *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                   in_stack_fffffffffffffa50,(bool)fSort);
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffa20);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)in_stack_fffffffffffffa20
                   ,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
                    CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
        FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)in_stack_fffffffffffffa50.rhs_,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)in_stack_fffffffffffffa48
                  );
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)in_stack_fffffffffffffa20
                  );
        local_1 = 1;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)in_stack_fffffffffffffa20
                  );
        goto LAB_0048f840;
      }
      bVar3 = true;
      local_174 = -1;
    }
  }
  if (((-1 < local_174) ||
      (bVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
               ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                         (in_stack_fffffffffffffa20,
                          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
                          CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)), !bVar4))
     || (bVar3)) {
    rng_00.lb_._4_4_ = var;
    rng_00.lb_._0_4_ = uVar6;
    rng_00.ub_ = (double)this_02;
    NLConstraint::NLConstraint
              (this_01,&lt_00->super_LinTerms,expr,rng_00,(bool)in_stack_fffffffffffffac3);
    in_stack_fffffffffffffa20 =
         (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)(CONCAT44(var,uVar6) + -0x208);
    NLConstraint::NLConstraint
              ((NLConstraint *)in_stack_fffffffffffffa20,
               (NLConstraint *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddConstraint<mp::NLConstraint>
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)in_stack_fffffffffffffa50.rhs_,(NLConstraint *)in_stack_fffffffffffffa48);
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffffa20);
    local_1 = 1;
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffffa20);
  }
  else {
    local_1 = 0;
  }
LAB_0048f840:
  LinearFunctionalConstraint::~LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)in_stack_fffffffffffffa20);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffa20);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }